

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_156bd::SolverDpllTriadSimd<2>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<2> *this,State *state)

{
  uint band_idx;
  uint64_t minirow;
  uint64_t minirow_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  State *pSVar6;
  long lVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char solution [81];
  State local_240;
  
  uVar2 = (anonymous_namespace)::solver_enum._504_8_;
  auVar9 = vpopcntq_avx512_vpopcntdq
                     (*(undefined1 (*) [16])(this->solution_).bands[0][0].configurations.vec);
  auVar10 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][1].configurations.vec);
  auVar13._8_8_ = 0xf000e00040000;
  auVar13._0_8_ = 0xf000e00040000;
  auVar12 = vpunpcklqdq_avx(auVar9,auVar10);
  auVar9 = vpunpckhqdq_avx(auVar9,auVar10);
  auVar11 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[0][2].configurations.vec);
  auVar9 = vpaddq_avx(auVar12,auVar9);
  auVar12 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][0].configurations.vec);
  auVar10 = vpunpcklqdq_avx(auVar11,auVar12);
  auVar12 = vpunpckhqdq_avx(auVar11,auVar12);
  auVar11 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][1].configurations.vec);
  auVar12 = vpaddq_avx(auVar10,auVar12);
  auVar10 = vpopcntq_avx512_vpopcntdq
                      (*(undefined1 (*) [16])(this->solution_).bands[1][2].configurations.vec);
  auVar15 = vpunpcklqdq_avx(auVar11,auVar10);
  auVar1 = vpunpckhqdq_avx(auVar11,auVar10);
  auVar10 = vpcmpeqd_avx(auVar10,auVar10);
  auVar13 = vpermi2w_avx512vl(auVar13,auVar9,auVar10);
  auVar10 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar11 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar9 = vpaddq_avx(auVar15,auVar1);
  auVar12 = vpermi2w_avx512vl(auVar10,auVar13,auVar12);
  auVar9 = vpermi2w_avx512vl(auVar11,auVar12,auVar9);
  auVar12._8_2_ = 0xfff6;
  auVar12._0_8_ = 0xfff6fff6fff6fff6;
  auVar12._10_2_ = 0xfff6;
  auVar12._12_2_ = 0xfff6;
  auVar12._14_2_ = 0xfff6;
  auVar9 = vpaddw_avx(auVar9,auVar12);
  auVar9 = vphminposuw_avx(auVar9);
  if ((auVar9 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    uVar4 = (ulong)(auVar9._0_4_ >> 0x10);
    band_idx = *(uint *)((anonymous_namespace)::tables + uVar4 * 4 + 0x18dc);
    auVar12 = *(undefined1 (*) [16])
               (this->solution_).bands[*(int *)((anonymous_namespace)::tables + uVar4 * 4 + 0x18b8)]
               [(int)band_idx].configurations.vec;
    auVar10 = vpshufb_avx(auVar12,_DAT_0010aba0);
    auVar11 = vpblendd_avx2(auVar10,(undefined1  [16])0x0,8);
    auVar1 = vpshufb_avx(auVar10,_DAT_0010abb0);
    auVar10 = vpand_avx(auVar12,auVar11);
    auVar11 = vpor_avx(auVar12,auVar11);
    auVar15 = vpshufb_avx(auVar1,_DAT_0010aba0);
    auVar12 = vpand_avx(auVar10,auVar1);
    auVar14 = vpternlogq_avx512vl(auVar10,auVar11,auVar1,0xf8);
    auVar10 = vpor_avx(auVar11,auVar1);
    auVar13 = vpblendd_avx2(auVar15,(undefined1  [16])0x0,8);
    auVar11 = vpshufb_avx(auVar15,_DAT_0010abb0);
    auVar15 = vpternlogq_avx512vl(auVar12,auVar14,auVar13,0xf8);
    auVar14 = vpternlogq_avx512vl(auVar14,auVar10,auVar13,0xf8);
    auVar10 = vpor_avx(auVar10,auVar13);
    auVar1 = vpshufb_avx(auVar11,_DAT_0010abb0);
    auVar16 = vpternlogq_avx512vl(auVar15,auVar14,auVar11,0xf8);
    auVar14 = vpternlogq_avx512vl(auVar14,auVar10,auVar11,0xf8);
    auVar10 = vpor_avx(auVar10,auVar11);
    auVar17 = vpternlogq_avx512vl(auVar16,auVar14,auVar1,0xf8);
    auVar10 = vpternlogq_avx512vl(auVar10,auVar14,auVar1,0xec);
    if ((auVar10 & ~auVar17) == (undefined1  [16])0x0) {
      auVar10 = vpand_avx(auVar15,auVar11);
      auVar10 = vpternlogq_avx512vl(auVar10,auVar12,auVar13,0xf8);
      auVar10 = vpternlogq_avx512vl(auVar10,auVar16,auVar1,0xf8);
      if ((auVar17 & ~auVar10) != (undefined1  [16])0x0) {
        auVar10 = vpandn_avx(auVar10,auVar17);
      }
    }
    else {
      auVar10 = vpandn_avx(auVar17,auVar10);
    }
    auVar12 = vpcmpeqd_avx(auVar12,auVar12);
    auVar12 = vpsignw_avx(auVar10,auVar12);
    auVar12 = vpand_avx(auVar10,auVar12);
    (anonymous_namespace)::solver_enum._496_8_ = (anonymous_namespace)::solver_enum._496_8_ + 1;
    if (auVar9._0_4_ < 0x30000) {
      auVar9 = vpand_avx(auVar12,*(undefined1 (*) [16])
                                  (this->solution_).bands[0][(int)band_idx].configurations.vec);
      State::State(&local_240,&this->solution_);
      pSVar6 = (State *)(ulong)band_idx;
      uVar4 = vpcmpgtq_avx512vl(auVar9,(undefined1  [16])0x0);
      auVar12 = vpcmpgtq_avx(auVar9,(undefined1  [16])0x0);
      auVar12 = vpslldq_avx(auVar12,1);
      auVar1._8_8_ = 1;
      auVar1._0_8_ = 1;
      auVar12 = vandnpd_avx512vl(auVar12,auVar1);
      auVar12 = vpsubq_avx512vl(auVar9,auVar12);
      bVar3 = (bool)((byte)(uVar4 & 3) & 1);
      auVar15._0_8_ = (ulong)bVar3 * auVar12._0_8_ | (ulong)!bVar3 * auVar9._0_8_;
      uVar4 = (uVar4 & 3) >> 1;
      auVar15._8_8_ = uVar4 * auVar12._8_8_ | (ulong)!SUB81(uVar4,0) * auVar9._8_8_;
      auVar12 = vpand_avx(auVar15,auVar9);
      auVar10 = vpor_avx(auVar12,*(undefined1 (*) [16])
                                  local_240.bands[0][(int)band_idx].eliminations.vec);
      *(undefined1 (*) [16])local_240.bands[0][(int)band_idx].eliminations.vec = auVar10;
      bVar3 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar3) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<2> *)&local_240,pSVar6)
         , (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_)
         ) {
        return;
      }
      pSVar6 = (State *)(ulong)band_idx;
      auVar9 = vpternlogq_avx512vl(auVar9,auVar12,
                                   *(undefined1 (*) [16])
                                    (this->solution_).bands[0][(int)band_idx].eliminations.vec,0xbe)
      ;
      *(undefined1 (*) [16])(this->solution_).bands[0][(int)band_idx].eliminations.vec = auVar9;
      bVar3 = BandEliminate<0>(&this->solution_,band_idx,0);
    }
    else {
      auVar9 = vpand_avx(auVar12,*(undefined1 (*) [16])
                                  (this->solution_).boxen[(long)(int)band_idx + -3].cells.vec);
      State::State(&local_240,&this->solution_);
      pSVar6 = (State *)(ulong)band_idx;
      uVar4 = vpcmpgtq_avx512vl(auVar9,(undefined1  [16])0x0);
      auVar12 = vpcmpgtq_avx(auVar9,(undefined1  [16])0x0);
      auVar12 = vpslldq_avx(auVar12,1);
      auVar10._8_8_ = 1;
      auVar10._0_8_ = 1;
      auVar12 = vandnpd_avx512vl(auVar12,auVar10);
      auVar12 = vpsubq_avx512vl(auVar9,auVar12);
      bVar3 = (bool)((byte)(uVar4 & 3) & 1);
      auVar11._0_8_ = (ulong)bVar3 * auVar12._0_8_ | (ulong)!bVar3 * auVar9._0_8_;
      uVar4 = (uVar4 & 3) >> 1;
      auVar11._8_8_ = uVar4 * auVar12._8_8_ | (ulong)!SUB81(uVar4,0) * auVar9._8_8_;
      auVar12 = vpand_avx(auVar11,auVar9);
      auVar10 = vpor_avx(auVar12,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)(int)band_idx + -3].cells.vec + 2) = auVar10;
      bVar3 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar3) &&
         (CountSolutionsConsistentWithPartialAssignment((SolverDpllTriadSimd<2> *)&local_240,pSVar6)
         , (anonymous_namespace)::solver_enum._488_8_ == (anonymous_namespace)::solver_enum._480_8_)
         ) {
        return;
      }
      pSVar6 = (State *)(ulong)band_idx;
      auVar9 = vpternlogq_avx512vl(auVar9,auVar12,
                                   *(undefined1 (*) [16])
                                    ((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec + 2
                                    ),0xbe);
      *(undefined1 (*) [16])((this->solution_).boxen[(long)(int)band_idx + -3].cells.vec + 2) =
           auVar9;
      bVar3 = BandEliminate<1>(&this->solution_,band_idx,0);
    }
    if (bVar3 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,pSVar6);
    }
  }
  else {
    (anonymous_namespace)::solver_enum._488_8_ = (anonymous_namespace)::solver_enum._488_8_ + 1;
    if ((anonymous_namespace)::solver_enum._504_8_ != 0) {
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 4) {
        minirow = (this->solution_).boxen[0].cells.vec[lVar7 + 2];
        minirow_00 = (this->solution_).boxen[0].cells.vec[lVar7 + 1];
        iVar5 = *(int *)((anonymous_namespace)::tables + lVar7 + 0x18b8) * 0x1b;
        iVar8 = *(int *)((anonymous_namespace)::tables + lVar7 + 0x18dc) * 3;
        ExtractMiniRow((this->solution_).boxen[0].cells.vec[lVar7],iVar8 + iVar5,(char *)&local_240)
        ;
        ExtractMiniRow(minirow_00,iVar5 + 9 + iVar8,(char *)&local_240);
        ExtractMiniRow(minirow,iVar5 + 0x12 + iVar8,(char *)&local_240);
      }
      (*(code *)uVar2)(&local_240,(anonymous_namespace)::solver_enum._512_8_);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }